

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

bool units::cleanUnitString(string *unit_string,uint64_t match_flags)

{
  byte *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  pointer pcVar4;
  byte *__s;
  _Alloc_hider __nptr;
  bool bVar5;
  char cVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  size_type sVar11;
  char *pcVar12;
  size_t sVar13;
  size_t sVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  void *pvVar16;
  void *pvVar17;
  size_type sVar18;
  size_type sVar19;
  size_type sVar20;
  uint *puVar21;
  undefined8 uVar22;
  const_iterator cVar23;
  size_t sVar24;
  char *pcVar25;
  long lVar26;
  char *pcVar27;
  byte *pbVar28;
  char *pcVar29;
  size_t sz;
  char *__data;
  ulong uVar30;
  byte bVar31;
  size_type __size;
  long lVar32;
  ulong uVar33;
  byte *pbVar34;
  size_t *in_R9;
  byte bVar35;
  size_type __n;
  pointer pcVar36;
  undefined8 unaff_R14;
  char *__data_2;
  byte bVar37;
  ulong uVar38;
  ulong uVar39;
  size_type sVar40;
  pointer pcVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  double dVar46;
  precise_unit pVar47;
  precise_unit pVar48;
  size_t reploc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  char in_stack_fffffffffffffa42;
  size_type local_598;
  undefined1 local_58a;
  undefined1 local_589;
  char *local_588;
  undefined4 local_57c;
  size_type local_578;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_570 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_470;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_578 = unit_string->_M_string_length;
  if ((cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                   spchar_abi_cxx11_), iVar9 != 0)) {
    paVar2 = &local_570[0].first.field_2;
    local_570[0].first._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_570," \t\n\r","");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_570,
                   '\0');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570[0].first._M_dataplus._M_p != paVar2) {
      operator_delete(local_570[0].first._M_dataplus._M_p,
                      local_570[0].first.field_2._M_allocated_capacity + 1);
    }
    __cxa_atexit(std::__cxx11::string::~string,
                 &cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_);
  }
  bVar31 = 0;
  uVar8 = (byte)(unit_string->_M_dataplus)._M_p[unit_string->_M_string_length - 1] - 0x2a;
  if ((uVar8 < 0x35) && ((0x10000000000021U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string);
    bVar31 = 1;
  }
  sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             unit_string,
                             cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_
                             ._M_dataplus._M_p,0,
                             cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_
                             ._M_string_length);
  if (sVar11 != 0) {
    if (sVar11 == 0xffffffffffffffff) {
      unit_string->_M_string_length = 0;
      *(unit_string->_M_dataplus)._M_p = '\0';
      return true;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,
               sVar11);
    sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_string,
                               cleanUnitString(std::__cxx11::string&,unsigned_long)::
                               spchar_abi_cxx11_._M_dataplus._M_p,0,
                               cleanUnitString(std::__cxx11::string&,unsigned_long)::
                               spchar_abi_cxx11_._M_string_length);
    bVar31 = 1;
  }
  bVar43 = (unit_string->_M_dataplus)._M_p[sVar11] == '/';
  if (bVar43) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
               sVar11,1,'1');
    bVar31 = 1;
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    pcVar12 = (unit_string->_M_dataplus)._M_p;
    uVar38 = unit_string->_M_string_length;
    pcVar25 = pcVar12 + uVar38;
    local_57c = (undefined4)CONCAT71((int7)((ulong)unaff_R14 >> 8),bVar43);
    pcVar29 = pcVar12;
    if (0 < (long)uVar38 >> 2) {
      pcVar29 = pcVar12 + (uVar38 & 0xfffffffffffffffc);
      lVar32 = ((long)uVar38 >> 2) + 1;
      pcVar12 = pcVar12 + 3;
      do {
        if (pcVar12[-3] < '\0') {
          pcVar12 = pcVar12 + -3;
          goto LAB_003e0ec4;
        }
        if (pcVar12[-2] < '\0') {
          pcVar12 = pcVar12 + -2;
          goto LAB_003e0ec4;
        }
        if (pcVar12[-1] < '\0') {
          pcVar12 = pcVar12 + -1;
          goto LAB_003e0ec4;
        }
        if (*pcVar12 < '\0') goto LAB_003e0ec4;
        lVar32 = lVar32 + -1;
        pcVar12 = pcVar12 + 4;
      } while (1 < lVar32);
    }
    lVar32 = (long)pcVar25 - (long)pcVar29;
    if (lVar32 == 1) {
LAB_003e0e8c:
      pcVar12 = pcVar29;
      if (-1 < *pcVar29) {
        pcVar12 = pcVar25;
      }
LAB_003e0ec4:
      if (pcVar12 != pcVar25) {
        bVar35 = 0;
        lVar32 = 0;
        do {
          pcVar25 = *(char **)((long)&unicodeReplacement(std::__cxx11::string&)::ucodeReplacements +
                              lVar32);
          sVar13 = strlen(pcVar25);
          for (sVar11 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)unit_string,pcVar25,0,sVar13); sVar11 != 0xffffffffffffffff;
              sVar11 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)unit_string,pcVar25,sVar11,sVar13)) {
            sVar13 = strlen(pcVar25);
            if ((sVar11 == 0 || sVar13 != 1) ||
               ((byte)(unit_string->_M_dataplus)._M_p[sVar11 - 1] < 0xc1)) {
              pcVar12 = *(char **)((long)&DAT_0053a0f8 + lVar32);
              sVar14 = strlen(pcVar12);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,sVar11,sVar13,pcVar12,sVar14);
              if (sVar11 == 0) {
                sVar11 = 0;
              }
              else if ((unit_string->_M_dataplus)._M_p[sVar11 - 1] == '\\') {
                sVar11 = sVar11 - 1;
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        unit_string,sVar11,1);
              }
              sVar13 = strlen(pcVar12);
              sVar11 = sVar13 + sVar11;
              bVar35 = 1;
            }
            else {
              sVar11 = sVar11 + 1;
            }
            sVar13 = strlen(pcVar25);
          }
          lVar32 = lVar32 + 0x10;
        } while (lVar32 != 0x420);
        bVar31 = bVar35 | bVar31;
      }
    }
    else {
      if (lVar32 == 2) {
LAB_003e0e84:
        pcVar12 = pcVar29;
        if (-1 < *pcVar29) {
          pcVar29 = pcVar29 + 1;
          goto LAB_003e0e8c;
        }
        goto LAB_003e0ec4;
      }
      if (lVar32 == 3) {
        pcVar12 = pcVar29;
        if (-1 < *pcVar29) {
          pcVar29 = pcVar29 + 1;
          goto LAB_003e0e84;
        }
        goto LAB_003e0ec4;
      }
    }
    lVar32 = 0;
    do {
      pcVar25 = *(char **)((long)&cleanUnitString::earlyCodeReplacements._M_elems[0].first + lVar32)
      ;
      sVar13 = strlen(pcVar25);
      sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,pcVar25,0,sVar13);
      if (sVar11 != 0xffffffffffffffff) {
        pcVar12 = *(char **)((long)&cleanUnitString::earlyCodeReplacements._M_elems[0].second +
                            lVar32);
        do {
          sVar13 = strlen(pcVar25);
          sVar14 = strlen(pcVar12);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  sVar11,sVar13,pcVar12,sVar14);
          sVar13 = strlen(pcVar25);
          sVar11 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              unit_string,pcVar25,sVar11 + 1,sVar13);
        } while (sVar11 != 0xffffffffffffffff);
        bVar31 = 1;
      }
      lVar32 = lVar32 + 0x10;
    } while (lVar32 != 0x40);
    sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           unit_string,
                           cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_.
                           _M_dataplus._M_p,0,
                           cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_.
                           _M_string_length);
    if (sVar11 == 0xffffffffffffffff) {
      local_598 = 0xffffffffffffffff;
    }
    else {
      local_588 = (char *)0x0;
      iVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,0,4,"per ");
      if (iVar9 == 0) {
        local_588 = (char *)0x2;
        pbVar15 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             unit_string,0,4,"1/",2);
        local_57c = (undefined4)CONCAT71((int7)((ulong)pbVar15 >> 8),1);
      }
      bVar43 = ReplaceStringInPlace(unit_string," per ",5,"/",(int)&local_588,in_R9);
      pcVar25 = (char *)unit_string->_M_string_length;
      sVar13 = (long)pcVar25 - (long)local_588;
      if ((pcVar25 < local_588 || sVar13 == 0) || local_588 == (char *)0x0) {
LAB_003e1235:
        if (pcVar25 != (char *)0x0) goto LAB_003e123e;
      }
      else {
        pcVar41 = (unit_string->_M_dataplus)._M_p;
        pcVar12 = local_588 + (long)pcVar41;
        pvVar16 = memchr(pcVar12,0x28,sVar13);
        if ((long)pvVar16 - (long)pcVar41 != 0xffffffffffffffff && pvVar16 != (void *)0x0) {
          pvVar17 = memchr(pcVar12,0x2f,sVar13);
          uVar38 = -(ulong)(pvVar17 == (void *)0x0) | (long)pvVar17 - (long)pcVar41;
          do {
            uVar39 = uVar38 + 1;
            sVar13 = unit_string->_M_string_length - uVar39;
            if (unit_string->_M_string_length < uVar39 || sVar13 == 0) {
LAB_003e11f2:
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        unit_string,')');
              uVar30 = 0xffffffffffffffff;
LAB_003e1206:
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unit_string,uVar39,1,'(');
              uVar33 = uVar30;
              uVar38 = uVar30 + 2;
            }
            else {
              pcVar4 = (unit_string->_M_dataplus)._M_p;
              pvVar17 = memchr(pcVar4 + uVar39,0x2f,sVar13);
              uVar30 = (long)pvVar17 - (long)pcVar4;
              uVar33 = -(ulong)(pvVar17 == (void *)0x0) | uVar30;
              uVar38 = uVar33;
              if ((ulong)((long)pvVar16 - (long)pcVar41) < uVar33) {
                if (uVar33 == 0xffffffffffffffff) goto LAB_003e11f2;
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         unit_string,uVar33,1,')');
                goto LAB_003e1206;
              }
            }
          } while (uVar33 != 0xffffffffffffffff);
          pcVar25 = (char *)unit_string->_M_string_length;
          goto LAB_003e1235;
        }
LAB_003e123e:
        pcVar12 = (char *)0x0;
        do {
          if ((pcVar12[(long)(unit_string->_M_dataplus)._M_p] != ' ') &&
             (pcVar12[(long)(unit_string->_M_dataplus)._M_p] != '\t')) goto LAB_003e1267;
          pcVar12 = pcVar12 + 1;
        } while (pcVar25 != pcVar12);
        pcVar12 = (char *)0xffffffffffffffff;
LAB_003e1267:
        pcVar12 = pcVar12 + 1;
        if (pcVar12 < pcVar25) {
          pcVar41 = (unit_string->_M_dataplus)._M_p;
          do {
            if ((pcVar12[(long)pcVar41] == '\t') || (pcVar12[(long)pcVar41] == ' '))
            goto LAB_003e129d;
            pcVar12 = pcVar12 + 1;
          } while (pcVar25 != pcVar12);
        }
        pcVar41 = (unit_string->_M_dataplus)._M_p;
        pcVar12 = (char *)0xffffffffffffffff;
LAB_003e129d:
        pcVar29 = (char *)0x0;
        do {
          if ((pcVar29[(long)pcVar41] == '*') || (pcVar29[(long)pcVar41] == '/')) goto LAB_003e12c9;
          pcVar29 = pcVar29 + 1;
        } while (pcVar25 + (pcVar25 == (char *)0x0) != pcVar29);
        pcVar29 = (char *)0xffffffffffffffff;
LAB_003e12c9:
        if (pcVar12 == (char *)0x2) {
          pcVar12 = (char *)0x2;
          if ((char *)0x4 < pcVar25) {
            pcVar27 = (char *)0x2;
            do {
              cVar6 = pcVar27[(long)pcVar41];
              if ((cVar6 != ' ') && (cVar6 != '\t')) {
                pcVar12 = (char *)0x2;
                if ((pcVar27 == (char *)0xffffffffffffffff) ||
                   (pcVar29 != (char *)0xffffffffffffffff || cVar6 == '(')) goto LAB_003e140d;
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_570,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         unit_string,0,2);
                iVar9 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_570,"fl");
                if ((iVar9 != 0) &&
                   (pVar47 = get_unit(&local_570[0].first,match_flags),
                   pVar47.base_units_ != (unit_data)0xfa94a488 || !NAN(pVar47.multiplier_))) {
                  (unit_string->_M_dataplus)._M_p[2] = '_';
                  pVar47 = get_unit(unit_string,match_flags);
                  if (pVar47.base_units_ == (unit_data)0xfa94a488 && NAN(pVar47.multiplier_)) {
                    (unit_string->_M_dataplus)._M_p[2] = '*';
                  }
                  pcVar12 = (char *)CLI::std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::find_first_of((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)unit_string," \t",3,2);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_570[0].first._M_dataplus._M_p != &local_570[0].first.field_2) {
                  operator_delete(local_570[0].first._M_dataplus._M_p,
                                  local_570[0].first.field_2._M_allocated_capacity + 1);
                }
                goto LAB_003e13fa;
              }
              pcVar27 = pcVar27 + 1;
            } while (pcVar25 != pcVar27);
            pcVar12 = (char *)0x2;
          }
LAB_003e140d:
          paVar2 = &local_570[0].first.field_2;
LAB_003e1417:
          if (pcVar12 + 2 == pcVar25) {
            if (pcVar29 == (char *)0xffffffffffffffff) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_570,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unit_string,0,(size_type)pcVar12);
              pVar47 = get_unit(&local_570[0].first,match_flags);
              bVar44 = pVar47.base_units_ != (unit_data)0xfa94a488;
              if (bVar44 || !NAN(pVar47.multiplier_)) {
                pcVar12[(long)(unit_string->_M_dataplus)._M_p] = '_';
                pVar48 = get_unit(unit_string,match_flags);
                if (pVar48.base_units_ == (unit_data)0xfa94a488 && NAN(pVar48.multiplier_)) {
                  pcVar12[(long)(unit_string->_M_dataplus)._M_p] = '*';
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_570[0].first._M_dataplus._M_p != paVar2) {
                operator_delete(local_570[0].first._M_dataplus._M_p,
                                local_570[0].first.field_2._M_allocated_capacity + 1);
              }
              if (bVar44 || !NAN(pVar47.multiplier_)) goto LAB_003e1586;
            }
            shortStringReplacement_abi_cxx11_(in_stack_fffffffffffffa42);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string
                    ,(size_type)(pcVar12 + 1),1,local_570[0].first._M_dataplus._M_p,
                    local_570[0].first._M_string_length);
LAB_003e153f:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_570[0].first._M_dataplus._M_p != paVar2) {
              operator_delete(local_570[0].first._M_dataplus._M_p,
                              local_570[0].first.field_2._M_allocated_capacity + 1);
            }
          }
          else if (((byte)pcVar12[(long)((unit_string->_M_dataplus)._M_p + 1)] - 0x20 < 0x3f) &&
                  ((0x400000000000c401U >>
                    ((ulong)((byte)pcVar12[(long)((unit_string->_M_dataplus)._M_p + 1)] - 0x20) &
                    0x3f) & 1) != 0)) {
            shortStringReplacement_abi_cxx11_(in_stack_fffffffffffffa42);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string
                    ,(size_type)(pcVar12 + 1),1,local_570[0].first._M_dataplus._M_p,
                    local_570[0].first._M_string_length);
            goto LAB_003e153f;
          }
          pcVar12 = pcVar12 + 1;
          pcVar25 = (char *)unit_string->_M_string_length;
          if (pcVar25 <= pcVar12) goto LAB_003e1586;
          while ((pcVar12[(long)(unit_string->_M_dataplus)._M_p] != '\t' &&
                 (pcVar12[(long)(unit_string->_M_dataplus)._M_p] != ' '))) {
            pcVar12 = pcVar12 + 1;
            if (pcVar25 == pcVar12) goto LAB_003e1586;
          }
          goto LAB_003e1417;
        }
LAB_003e13fa:
        if (pcVar12 != (char *)0xffffffffffffffff) {
          pcVar25 = (char *)unit_string->_M_string_length;
          goto LAB_003e140d;
        }
      }
LAB_003e1586:
      sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string," of ",0,4);
      local_598 = 0xffffffffffffffff;
      while (sVar18 = local_598, sVar11 != 0xffffffffffffffff) {
        sVar18 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)unit_string,
                                   cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                   spchar_abi_cxx11_._M_dataplus._M_p,sVar11 + 4,
                                   cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                   spchar_abi_cxx11_._M_string_length);
        if ((sVar18 != 0xffffffffffffffff) &&
           ((cVar6 = (unit_string->_M_dataplus)._M_p[sVar18], sVar18 = sVar11, cVar6 == '(' ||
            (cVar6 == '[')))) break;
        sVar11 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            unit_string," of ",sVar11 + 3,4);
      }
      local_598 = sVar18;
      if ((cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_ == '\0') &&
         (iVar9 = __cxa_guard_acquire(&cleanSpaces(std::__cxx11::string&,bool)::
                                       spaceChars_abi_cxx11_), iVar9 != 0)) {
        paVar2 = &local_570[0].first.field_2;
        local_570[0].first._M_string_length = 4;
        local_570[0].first.field_2._0_5_ = 0xd0a0920;
        local_570[0].first._M_dataplus._M_p = (pointer)paVar2;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_570,'\0');
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570[0].first._M_dataplus._M_p != paVar2) {
          operator_delete(local_570[0].first._M_dataplus._M_p,
                          local_570[0].first.field_2._M_allocated_capacity + 1);
        }
        __cxa_atexit(std::__cxx11::string::~string,
                     &cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_);
      }
      paVar2 = &local_570[0].first.field_2;
      local_570[0].first._M_string_length = 7;
      local_570[0].first.field_2._M_allocated_capacity = 0x20657261757173;
      local_570[0].first._M_dataplus._M_p = (pointer)paVar2;
      bVar44 = isolatePriorModifier(unit_string,&local_570[0].first,'d','D');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570[0].first._M_dataplus._M_p != paVar2) {
        operator_delete(local_570[0].first._M_dataplus._M_p,
                        local_570[0].first.field_2._M_allocated_capacity + 1);
      }
      local_570[0].first._M_string_length = 6;
      local_570[0].first.field_2._0_7_ = 0x206369627563;
      local_570[0].first._M_dataplus._M_p = (pointer)paVar2;
      bVar5 = isolatePriorModifier(unit_string,&local_570[0].first,'_','-');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570[0].first._M_dataplus._M_p != paVar2) {
        operator_delete(local_570[0].first._M_dataplus._M_p,
                        local_570[0].first.field_2._M_allocated_capacity + 1);
      }
      local_570[0].first.field_2._M_allocated_capacity = 0x6465726175717320;
      local_570[0].first._M_string_length = 8;
      local_570[0].first.field_2._M_local_buf[8] = '\0';
      bVar35 = 0;
      local_570[0].first._M_dataplus._M_p = (pointer)paVar2;
      sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,paVar2->_M_local_buf,0,8);
      if (sVar11 != 0xffffffffffffffff) {
        sVar19 = 0xffffffffffffffff;
        if (unit_string->_M_string_length != 0) {
          uVar38 = unit_string->_M_string_length - 1;
          if (sVar11 - 1 <= uVar38) {
            uVar38 = sVar11 - 1;
          }
          do {
            sVar19 = uVar38;
            if ((unit_string->_M_dataplus)._M_p[uVar38] != ' ') break;
            bVar42 = uVar38 != 0;
            uVar38 = uVar38 - 1;
            sVar19 = 0xffffffffffffffff;
          } while (bVar42);
        }
        sVar19 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find_last_of(unit_string," */",sVar19,3);
        uVar38 = unit_string->_M_string_length;
        if ((sVar19 < uVar38 && sVar19 != 0) &&
           (pcVar41 = (unit_string->_M_dataplus)._M_p, pcVar41[sVar19] == ' ')) {
          cVar6 = pcVar41[sVar19 + 1];
          bVar42 = true;
          bVar45 = true;
          if ((cVar6 != '*') && (cVar6 != '/')) {
            cVar3 = pcVar41[sVar19 - 1];
            in_R9 = (size_t *)CONCAT71((int7)((ulong)in_R9 >> 8),cVar3 == '*');
            bVar45 = cVar3 == '/' || cVar3 == '*';
          }
          bVar35 = (cVar6 == '*' || cVar6 == '/') | bVar45;
          bVar35 = cVar6 == ')' | bVar35 | bVar35;
          bVar45 = (bool)(cVar6 == '-' | bVar35 | bVar35);
          if (!bVar45) {
            bVar42 = pcVar41[sVar19 - 1] == ')';
          }
          bVar42 = (bool)(bVar42 | bVar45);
          bVar45 = true;
          if (!bVar42) {
            bVar45 = pcVar41[sVar19 - 1] == '-';
          }
          if (!(bool)(bVar45 | bVar42)) {
            uVar39 = sVar11 + 1;
            if (sVar11 < uVar38 - 1) {
              uVar38 = uVar39;
            }
            do {
              sVar18 = uVar38;
              if (sVar18 == 0) goto LAB_003e2b5e;
              uVar38 = sVar18 - 1;
            } while (pcVar41[sVar18 - 1] != '/');
            if (sVar18 - 1 < sVar11) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unit_string,sVar18,1,'(');
              sVar13 = unit_string->_M_string_length - uVar39;
              if (unit_string->_M_string_length < uVar39 || sVar13 == 0) {
LAB_003e2b4a:
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            unit_string,')');
              }
              else {
                pcVar41 = (unit_string->_M_dataplus)._M_p;
                pvVar16 = memchr(pcVar41 + uVar39,0x2f,sVar13);
                uVar38 = (long)pvVar16 - (long)pcVar41;
                if (pvVar16 == (void *)0x0 || uVar38 == 0xffffffffffffffff) goto LAB_003e2b4a;
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         unit_string,uVar38,1,')');
                bVar35 = 1;
                if (uVar38 < sVar19 + 1) goto LAB_003e181f;
              }
              sVar19 = sVar19 + 1;
              pcVar41 = (unit_string->_M_dataplus)._M_p;
            }
LAB_003e2b5e:
            pcVar41[sVar19] = '*';
            bVar35 = 1;
            goto LAB_003e181f;
          }
        }
        bVar35 = 0;
      }
LAB_003e181f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570[0].first._M_dataplus._M_p != paVar2) {
        operator_delete(local_570[0].first._M_dataplus._M_p,
                        local_570[0].first.field_2._M_allocated_capacity + 1);
      }
      bVar37 = (byte)local_57c | bVar43;
      bVar35 = (bVar44 || bVar5) | bVar35;
      sVar11 = 0;
LAB_003e185a:
      while (sVar11 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                      find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)unit_string,
                                    cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                                    sVar11,DAT_005480f0), sVar11 == 0) {
LAB_003e1c1c:
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   0,1);
        bVar35 = 1;
        sVar11 = 0;
      }
      if (sVar11 == 0xffffffffffffffff) goto LAB_003e1c90;
      if ((bVar37 & 1) != 0) {
LAB_003e188f:
        if ((unit_string->_M_dataplus)._M_p[sVar11 - 1] == '.') {
          sVar11 = sVar11 + 1;
          bVar35 = 1;
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                sVar11,1);
          bVar35 = 1;
          bVar37 = 1;
        }
        goto LAB_003e185a;
      }
      sVar18 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)unit_string,
                                   cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                                   sVar11,DAT_005480f0);
      if (sVar18 != 0xffffffffffffffff) {
        __s = (byte *)(unit_string->_M_dataplus)._M_p;
        if (sVar11 == 1) {
          if ((__s[sVar18] - 0x2a < 0x35) &&
             ((0x10000000400021U >> ((ulong)(__s[sVar18] - 0x2a) & 0x3f) & 1) != 0)) {
            sVar11 = 1;
            goto LAB_003e19bf;
          }
          uVar38 = unit_string->_M_string_length;
          if (7 < uVar38) {
            pvVar16 = memchr(__s,0x2a,uVar38);
            if ((sVar18 < uVar38) &&
               (uVar39 = sVar18, pvVar16 == (void *)0x0 || (long)pvVar16 - (long)__s == -1)) {
              do {
                if ((__s[uVar39] == 0x2f) || (__s[uVar39] == 0x5e)) {
                  if (uVar39 < 9) goto LAB_003e1c4c;
                  break;
                }
                uVar39 = uVar39 + 1;
              } while (uVar38 != uVar39);
            }
            goto LAB_003e1996;
          }
LAB_003e1c4c:
          __s[1] = 0x2a;
          sVar11 = 1;
LAB_003e1c5b:
          bVar35 = 1;
          bVar37 = 1;
        }
        else {
LAB_003e1996:
          bVar35 = __s[sVar11 - 1];
          if (bVar35 == 0x2f) {
LAB_003e19bf:
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  sVar11,1);
            bVar35 = 1;
            bVar37 = 0;
          }
          else {
            if (bVar35 != 0x2e) {
              if ((bVar35 == 0x2a) ||
                 ((sVar18 < unit_string->_M_string_length &&
                  ((__s[sVar18] == 0x2f || (__s[sVar18] == 0x2a)))))) goto LAB_003e19bf;
              pbVar1 = __s + sVar11;
              pbVar28 = __s;
              if (0 < (long)sVar11 >> 2) {
                lVar32 = ((long)sVar11 >> 2) + 1;
                pbVar34 = __s + 3;
                do {
                  pbVar28 = pbVar34;
                  bVar35 = pbVar28[-3];
                  if ((9 < (byte)(bVar35 - 0x30)) &&
                     ((0x2f < bVar35 || ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0)
                      ))) {
                    pbVar28 = pbVar28 + -3;
                    goto LAB_003e1b37;
                  }
                  bVar35 = pbVar28[-2];
                  if ((9 < (byte)(bVar35 - 0x30)) &&
                     ((0x2f < bVar35 || ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0)
                      ))) {
                    pbVar28 = pbVar28 + -2;
                    goto LAB_003e1b37;
                  }
                  bVar35 = pbVar28[-1];
                  if ((9 < (byte)(bVar35 - 0x30)) &&
                     ((0x2f < bVar35 || ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0)
                      ))) {
                    pbVar28 = pbVar28 + -1;
                    goto LAB_003e1b37;
                  }
                  bVar35 = *pbVar28;
                  if ((9 < (byte)(bVar35 - 0x30)) &&
                     ((0x2f < bVar35 || ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0)
                      ))) goto LAB_003e1b37;
                  lVar32 = lVar32 + -1;
                  pbVar34 = pbVar28 + 4;
                  pbVar28 = __s + (sVar11 & 0xfffffffffffffffc);
                } while (1 < lVar32);
              }
              lVar32 = (long)pbVar1 - (long)pbVar28;
              if (lVar32 == 1) {
LAB_003e1b02:
                bVar35 = *pbVar28;
                if ((9 < (byte)(bVar35 - 0x30)) &&
                   ((0x2f < bVar35 || ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0)))
                   ) goto LAB_003e1b37;
              }
              else {
                if (lVar32 == 2) {
LAB_003e1ae6:
                  bVar35 = *pbVar28;
                  if (((byte)(bVar35 - 0x30) < 10) ||
                     ((bVar35 < 0x30 && ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) != 0)
                      ))) {
                    pbVar28 = pbVar28 + 1;
                    goto LAB_003e1b02;
                  }
                }
                else {
                  if (lVar32 != 3) goto LAB_003e1c44;
                  bVar35 = *pbVar28;
                  if (((byte)(bVar35 - 0x30) < 10) ||
                     ((bVar35 < 0x30 && ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) != 0)
                      ))) {
                    pbVar28 = pbVar28 + 1;
                    goto LAB_003e1ae6;
                  }
                }
LAB_003e1b37:
                if (pbVar28 != pbVar1) {
                  if (sVar11 == 0) goto LAB_003e1c1c;
                  sVar18 = 0;
                  lVar32 = 0;
                  do {
                    lVar32 = lVar32 + (ulong)(__s[sVar18] == 0x2f);
                    sVar18 = sVar18 + 1;
                  } while (sVar11 != sVar18);
                  if (((lVar32 == 1) &&
                      (sVar19 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                rfind(unit_string,"/sq",sVar11,3), sVar19 == 0xffffffffffffffff)) &&
                     (sVar19 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               rfind(unit_string,"/cu",sVar11,3), sVar19 == 0xffffffffffffffff)) {
                    sVar18 = CLI::std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)unit_string,
                                               cleanSpaces(std::__cxx11::string&,bool)::
                                               spaceChars_abi_cxx11_,sVar11,DAT_005480f0);
                    sVar20 = CLI::std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)unit_string,anon_var_dwarf_2ad6c60,sVar11,9);
                    if (((sVar18 != 0xffffffffffffffff) && (sVar20 != sVar18)) &&
                       (pcVar41 = (unit_string->_M_dataplus)._M_p,
                       9 < (byte)(pcVar41[sVar11 - 1] - 0x30U))) {
                      pcVar41[sVar11] = '*';
                      goto LAB_003e1c5b;
                    }
                  }
                  goto LAB_003e188f;
                }
              }
LAB_003e1c44:
              *pbVar1 = 0x2a;
              goto LAB_003e1c5b;
            }
            sVar11 = sVar11 + 1;
            bVar35 = 1;
            bVar37 = 0;
          }
        }
        goto LAB_003e185a;
      }
      if (unit_string->_M_string_length < sVar11) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                   sVar11);
      }
      unit_string->_M_string_length = sVar11;
      (unit_string->_M_dataplus)._M_p[sVar11] = '\0';
      bVar35 = 1;
LAB_003e1c90:
      if (unit_string->_M_string_length == 0) {
        return true;
      }
      bVar31 = bVar31 | bVar35;
    }
    sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  "10*",0,3);
    while (sVar11 != 0xffffffffffffffff) {
      uVar38 = sVar11 + 3;
      if (uVar38 < unit_string->_M_string_length) {
        pcVar41 = (unit_string->_M_dataplus)._M_p;
        bVar35 = pcVar41[uVar38];
        if ((((byte)(bVar35 - 0x30) < 10) ||
            ((bVar35 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) != 0)))) &&
           ((sVar11 == 0 ||
            ((bVar35 = pcVar41[sVar11 - 1], 9 < (byte)(bVar35 - 0x30) &&
             (((0x3a < bVar35 - 0x2b ||
               ((0x40000000400000dU >> ((ulong)(bVar35 - 0x2b) & 0x3f) & 1) == 0)) ||
              ((sVar11 != 1 && ((bVar35 == 0x2e && ((byte)(pcVar41[sVar11 - 2] - 0x3aU) < 0xf6))))))
             )))))) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_570,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 uVar38,0xffffffffffffffff);
          __nptr._M_p = local_570[0].first._M_dataplus._M_p;
          if (local_570[0].first._M_string_length != 0) {
            cVar6 = *local_570[0].first._M_dataplus._M_p;
            if ((cVar6 == '-') || (cVar6 == '+')) {
              cVar6 = local_570[0].first._M_dataplus._M_p[1];
              uVar39 = 2;
            }
            else {
              uVar39 = 1;
            }
            if ((byte)(cVar6 - 0x30U) < 10) {
              if (uVar39 < local_570[0].first._M_string_length) {
                do {
                  uVar33 = uVar39 + 1;
                  if (9 < (byte)(local_570[0].first._M_dataplus._M_p[uVar39] - 0x30U)) {
                    uVar8 = (byte)local_570[0].first._M_dataplus._M_p[uVar39] - 0x2e;
                    if ((((uVar8 < 0x38) && ((0x80000000800001U >> ((ulong)uVar8 & 0x3f) & 1) != 0))
                        && (uVar33 < local_570[0].first._M_string_length)) &&
                       (((byte)(local_570[0].first._M_dataplus._M_p[uVar33] - 0x30U) < 10 ||
                        ((local_570[0].first._M_dataplus._M_p[uVar33] - 0x2bU & 0xfd) == 0))))
                    goto LAB_003e1ea0;
                    break;
                  }
                  uVar39 = uVar33;
                } while (uVar33 != local_570[0].first._M_string_length);
              }
              puVar21 = (uint *)__errno_location();
              uVar8 = *puVar21;
              *puVar21 = 0;
              lVar32 = strtol(__nptr._M_p,&local_588,10);
              if (local_588 == __nptr._M_p) {
                uVar22 = std::__throw_invalid_argument("stoi");
LAB_003e3347:
                if (local_570[0].first._M_dataplus._M_p != (pointer)(ulong)uVar8) {
                  operator_delete(local_570[0].first._M_dataplus._M_p,
                                  local_570[0].first.field_2._M_allocated_capacity + 1);
                }
                __cxa_guard_abort(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_);
                _Unwind_Resume(uVar22);
              }
              uVar10 = (uint)lVar32;
              if (((int)uVar10 != lVar32) || (*puVar21 == 0x22)) {
                uVar22 = std::__throw_out_of_range("stoi");
                goto LAB_003e3347;
              }
              if (*puVar21 == 0) {
                *puVar21 = uVar8;
              }
              uVar8 = -uVar10;
              if (0 < (int)uVar10) {
                uVar8 = uVar10;
              }
              if (uVar8 < 0x27) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          unit_string,sVar11,3,"1e",2);
              }
            }
          }
LAB_003e1ea0:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_570[0].first._M_dataplus._M_p != &local_570[0].first.field_2) {
            operator_delete(local_570[0].first._M_dataplus._M_p,
                            local_570[0].first.field_2._M_allocated_capacity + 1);
          }
        }
      }
      sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,"10*",uVar38,3);
    }
  }
  else {
    local_598 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       unit_string,"of(",0,3);
  }
  if ((*(unit_string->_M_dataplus)._M_p == '(') &&
     (removeOuterParenthesis(unit_string), unit_string->_M_string_length == 0)) {
    return true;
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    bVar43 = ReplaceStringInPlace(unit_string,"**",2,"^",(int)local_570,in_R9);
    bVar31 = bVar43 | bVar31;
  }
  if (((uint)match_flags >> 9 & 1) != 0) {
    if ((ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_ == '\0') &&
       (iVar9 = __cxa_guard_acquire(&ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_),
       iVar9 != 0)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (local_570,(char (*) [2])0x40ed46,(char (*) [2])0x42b982);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (local_570 + 1,(char (*) [2])0x435091,(char (*) [2])0x432422);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (local_570 + 2,(char (*) [2])0x40ef26,(char (*) [2])0x41454c);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (local_570 + 3,(char (*) [3])"MM",(char (*) [3])0x434b59);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_470,(char (*) [3])"NM",(char (*) [3])"nm");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_430,(char (*) [3])0x40ccfa,(char (*) [3])0x4309ce);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_3f0,(char (*) [3])"GS",(char (*) [3])"Gs");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[4],_true>
                (&local_3b0,(char (*) [3])"GL",(char (*) [4])"Gal");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_370,(char (*) [3])"MG",(char (*) [3])"mg");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
                (&local_330,(char (*) [4])"[G]",(char (*) [4])"[g]");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_2f0,(char (*) [3])"PG",(char (*) [3])"pg");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_2b0,(char (*) [3])0x42fc54,(char (*) [3])0x431644);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_270,(char (*) [3])0x42fc88,(char (*) [3])0x40eec0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_230,(char (*) [3])0x434e7b,(char (*) [3])0x433af4);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_1f0,(char (*) [3])0x432012,(char (*) [3])0x4320de);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
                (&local_1b0,(char (*) [4])"RAD",(char (*) [4])0x4311c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[8],_true>
                (&local_170,(char (*) [3])"GB",(char (*) [8])"gilbert");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_130,(char (*) [3])"WB",(char (*) [3])"Wb");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_f0,(char (*) [3])0x428a99,(char (*) [3])"cP");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_b0,(char (*) [3])"EV",(char (*) [3])"eV");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_70,(char (*) [3])"PT",(char (*) [3])"pT");
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,local_570,
                 &stack0xffffffffffffffd0,0,&local_588,&local_589,&local_58a);
      lVar32 = 0x500;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&local_570[0].first._M_dataplus._M_p + lVar32));
        lVar32 = lVar32 + -0x40;
      } while (lVar32 != -0x40);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_);
    }
    sVar19 = unit_string->_M_string_length;
    if (sVar19 != 0) {
      pcVar41 = (unit_string->_M_dataplus)._M_p;
      sVar40 = 0;
      do {
        iVar9 = toupper((int)pcVar41[sVar40]);
        pcVar41[sVar40] = (char)iVar9;
        sVar40 = sVar40 + 1;
      } while (sVar19 != sVar40);
    }
    cVar23 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,unit_string);
    if (cVar23.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pcVar25 = (unit_string->_M_dataplus)._M_p;
      if (*pcVar25 == 'P') {
        cVar6 = 'p';
LAB_003e2003:
        *pcVar25 = cVar6;
        pcVar25 = (unit_string->_M_dataplus)._M_p;
      }
      else if (*pcVar25 == 'M') {
        cVar6 = 'm';
        goto LAB_003e2003;
      }
      sVar19 = unit_string->_M_string_length;
      if (pcVar25[sVar19 - 1] == 'M') {
        if (sVar19 == 3) {
          dVar46 = getPrefixMultiplier2Char(*pcVar25,pcVar25[1]);
        }
        else {
          if (sVar19 != 2) goto LAB_003e2049;
          dVar46 = getPrefixMultiplier(*pcVar25);
        }
        if ((dVar46 != 0.0) || (NAN(dVar46))) {
          pcVar25[sVar19 - 1] = 'm';
        }
      }
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)cVar23.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._M_cur + 0x28));
    }
LAB_003e2049:
    sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  "/S",0,2);
    if (sVar11 != 0xffffffffffffffff) {
      (unit_string->_M_dataplus)._M_p[sVar11 + 1] = 's';
    }
    sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  "/G",0,2);
    bVar31 = 1;
    if (sVar11 != 0xffffffffffffffff) {
      (unit_string->_M_dataplus)._M_p[sVar11 + 1] = 'g';
    }
  }
  uVar38 = unit_string->_M_string_length;
  if ((match_flags >> 0x24 & 1) == 0) {
    if (uVar38 != 0) {
      do {
        if (uVar38 == 0) goto LAB_003e2263;
        lVar32 = uVar38 - 1;
        uVar38 = uVar38 - 1;
      } while ((unit_string->_M_dataplus)._M_p[lVar32] != '<');
      sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,"<sup>",0,5);
      while (sVar11 != 0xffffffffffffffff) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                sVar11,5,"^",1);
        sVar11 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            unit_string,"</sup>",0,6);
        if (sVar11 == 0xffffffffffffffff) {
          sVar11 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              unit_string,"<\\/sup>",0,7);
          if (sVar11 != 0xffffffffffffffff) {
            sVar18 = 8;
            goto LAB_003e2174;
          }
        }
        else {
          sVar18 = 6;
LAB_003e2174:
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  sVar11,sVar18,"",0);
        }
        sVar11 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            unit_string,"<sup>",0,5);
      }
      sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,"<sub>",0,5);
      while (sVar11 != 0xffffffffffffffff) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                sVar11,5,"_",1);
        sVar11 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            unit_string,"</sub>",0,6);
        if (sVar11 == 0xffffffffffffffff) {
          sVar11 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              unit_string,"<\\/sub>",0,7);
          if (sVar11 != 0xffffffffffffffff) {
            sVar18 = 8;
            goto LAB_003e223a;
          }
        }
        else {
          sVar18 = 6;
LAB_003e223a:
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  sVar11,sVar18,"",0);
        }
        sVar11 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            unit_string,"<sub>",0,5);
      }
    }
LAB_003e2263:
    lVar32 = 0;
    do {
      pcVar25 = *(char **)((long)&cleanUnitString::allCodeReplacements._M_elems[0].first + lVar32);
      sVar13 = strlen(pcVar25);
      sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,pcVar25,0,sVar13);
      if (sVar11 != 0xffffffffffffffff) {
        pcVar12 = *(char **)((long)&cleanUnitString::allCodeReplacements._M_elems[0].second + lVar32
                            );
        do {
          sVar13 = strlen(pcVar25);
          sVar14 = strlen(pcVar12);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  sVar11,sVar13,pcVar12,sVar14);
          sVar13 = strlen(pcVar25);
          sVar11 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              unit_string,pcVar25,sVar11 + 1,sVar13);
        } while (sVar11 != 0xffffffffffffffff);
        bVar31 = 1;
      }
      lVar32 = lVar32 + 0x10;
    } while (lVar32 != 0x210);
    uVar38 = unit_string->_M_string_length;
  }
  if ((1 < uVar38) &&
     (pcVar41 = (unit_string->_M_dataplus)._M_p, (pcVar41[uVar38 - 1] & 0xfeU) == 0x32)) {
    pcVar25 = pcVar41 + (uVar38 - 1);
    if (((pcVar41[uVar38 - 2] == '-') || (pcVar41[uVar38 - 2] == '+')) && (uVar38 != 2)) {
      pcVar25 = pcVar41 + (uVar38 - 2);
    }
    if (9 < (byte)(pcVar25[-1] - 0x30U)) {
      uVar8 = (byte)pcVar25[-1] - 0x2a;
      if (uVar8 < 0x3c) {
        if ((0x81000000800003aU >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
          if ((ulong)uVar8 != 0) goto LAB_003e2b7d;
          pcVar25[-1] = '^';
        }
      }
      else {
LAB_003e2b7d:
        if (*pcVar25 == '+') {
          *pcVar25 = '^';
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         unit_string,(long)pcVar25 - (long)pcVar41,0,1,'^');
        }
      }
    }
  }
  uVar38 = unit_string->_M_string_length;
  if ((match_flags >> 0x24 & 1) != 0) goto joined_r0x003e2506;
  if (uVar38 != 0) {
    pcVar41 = (unit_string->_M_dataplus)._M_p;
    uVar39 = uVar38;
    do {
      uVar33 = uVar39;
      if (uVar33 == 0) goto LAB_003e23bf;
      uVar39 = uVar33 - 1;
    } while (pcVar41[uVar33 - 1] != '.');
    if (9 < (byte)(pcVar41[uVar33] - 0x30U)) {
      pvVar16 = memchr(pcVar41,0x2e,uVar38);
      uVar39 = (long)pvVar16 - (long)pcVar41;
      iVar9 = 0;
      bVar43 = false;
      if (uVar39 == 0xffffffffffffffff || pvVar16 == (void *)0x0) {
LAB_003e2b9c:
        sVar11 = -(ulong)(pvVar16 == (void *)0x0) | uVar39;
LAB_003e2bac:
        if (sVar11 == 0) {
          if (1 < uVar38) {
            pcVar25 = (unit_string->_M_dataplus)._M_p;
            if ((byte)(pcVar25[1] - 0x30U) < 10) {
              iVar9 = iVar9 + 1;
            }
            else {
              if (!bVar43) {
                while ((*pcVar25 == '.' || (*pcVar25 == ' '))) {
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             unit_string,0,1);
                  pcVar25 = (unit_string->_M_dataplus)._M_p;
                }
                sVar18 = 0xffffffffffffffff;
                goto LAB_003e2c81;
              }
              *pcVar25 = '*';
            }
          }
          sVar18 = 0;
        }
        else {
          if (sVar11 == 0xffffffffffffffff) goto LAB_003e2cd3;
          pcVar41 = (unit_string->_M_dataplus)._M_p;
          sVar18 = sVar11;
          if ((byte)(pcVar41[sVar11 - 1] - 0x30U) < 10) {
            if ((byte)(pcVar41[sVar11 + 1] - 0x30U) < 10) {
LAB_003e2c0f:
              iVar9 = iVar9 + 1;
              goto LAB_003e2c81;
            }
          }
          else if (pcVar41[sVar11 - 1] == '*') goto LAB_003e2c0f;
          if (bVar43) {
            pcVar41[sVar11] = '*';
          }
          else {
            sVar18 = sVar11 - 1;
            while ((pcVar41[sVar11] == '.' || (pcVar41[sVar11] == ' '))) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string
                    ,sVar11,1);
              pcVar41 = (unit_string->_M_dataplus)._M_p;
            }
          }
        }
LAB_003e2c81:
        uVar39 = sVar18 + 1;
        uVar38 = unit_string->_M_string_length;
        sVar11 = 0xffffffffffffffff;
        if (uVar39 <= uVar38 && uVar38 - uVar39 != 0) {
          pcVar41 = (unit_string->_M_dataplus)._M_p;
          pvVar16 = memchr(pcVar41 + uVar39,0x2e,uVar38 - uVar39);
          sVar11 = -(ulong)(pvVar16 == (void *)0x0) | (long)pvVar16 - (long)pcVar41;
        }
        goto LAB_003e2bac;
      }
      cVar6 = '\0';
      uVar33 = uVar39;
LAB_003e290e:
      cVar3 = cVar6;
      if (uVar33 == 0) {
        if ((uVar38 != 1) && (9 < (byte)(pcVar41[1] - 0x30U))) {
          cVar3 = '\x01';
        }
      }
      else {
        if (uVar33 == 0xffffffffffffffff) goto LAB_003e2b90;
        if ((byte)(pcVar41[uVar33 - 1] - 0x30U) < 10) {
          cVar7 = pcVar41[uVar33 + 1];
          if ((byte)(cVar7 - 0x30U) < 10) goto LAB_003e297c;
        }
        else {
          if (pcVar41[uVar33 - 1] == '*') {
            cVar6 = '\x02';
LAB_003e2b90:
            bVar43 = cVar6 == '\x01';
            goto LAB_003e2b9c;
          }
          cVar7 = pcVar41[uVar33 + 1];
        }
        cVar6 = '\x02';
        if ((uVar33 == uVar38 - 1) || (cVar3 = '\x01', cVar7 == ' ')) goto LAB_003e2b90;
      }
LAB_003e297c:
      cVar6 = cVar3;
      uVar30 = uVar33 + 1;
      uVar33 = 0xffffffffffffffff;
      if (uVar30 <= uVar38 && uVar38 - uVar30 != 0) {
        pvVar17 = memchr(pcVar41 + uVar30,0x2e,uVar38 - uVar30);
        uVar33 = -(ulong)(pvVar17 == (void *)0x0) | (long)pvVar17 - (long)pcVar41;
      }
      goto LAB_003e290e;
    }
  }
LAB_003e23bf:
  for (sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       unit_string,"()",0,2); sVar11 != 0xffffffffffffffff;
      sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,"()",sVar11,2)) {
    if ((sVar11 + 2 < unit_string->_M_string_length) &&
       ((unit_string->_M_dataplus)._M_p[sVar11 + 2] == '^')) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 sVar11,2,"*1",2);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 sVar11,2);
    }
  }
  clearEmptySegments(unit_string);
  for (sVar24 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       unit_string,"(1)^",0,4); sVar24 != 0xffffffffffffffff;
      sVar24 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,"(1)^",sVar24,4)) {
    pcVar41 = (unit_string->_M_dataplus)._M_p;
    cVar6 = pcVar41[sVar24 + 4];
    if ((cVar6 == '-') || (sz = 4, cVar6 == '+')) {
      if (unit_string->_M_string_length <= sVar24 + 5) {
        multiplyRep(unit_string,sVar24,5);
        break;
      }
      cVar6 = pcVar41[sVar24 + 5];
      sz = 5;
    }
    if ((byte)(cVar6 - 0x30U) < 10) {
      do {
        sz = sz + 1;
        if (unit_string->_M_string_length <= sz + sVar24) break;
      } while ((byte)(pcVar41[sz + sVar24] - 0x30U) < 10);
    }
    multiplyRep(unit_string,sVar24,sz);
  }
  sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                "^1",0,2);
  while (sVar11 != 0xffffffffffffffff) {
    uVar38 = sVar11 + 2;
    if ((unit_string->_M_string_length <= uVar38) ||
       (9 < (byte)((unit_string->_M_dataplus)._M_p[uVar38] - 0x30U))) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 sVar11,2);
      uVar38 = sVar11;
    }
    sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                  "^1",uVar38,2);
  }
  for (sVar24 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       unit_string,"^(1)",0,4); sVar24 != 0xffffffffffffffff;
      sVar24 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      unit_string,"^(1)",sVar24,4)) {
    multiplyRep(unit_string,sVar24,4);
  }
  if (unit_string->_M_string_length == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,'1')
    ;
    return true;
  }
  do {
    do {
      bVar35 = *(unit_string->_M_dataplus)._M_p;
      if (((1 < bVar35 - 0x29) && (bVar35 != 0x7d)) && (bVar35 != 0x5d)) goto LAB_003e2638;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,
                 1);
      if (unit_string->_M_string_length == 0) {
        return true;
      }
      bVar31 = 1;
    } while (*(unit_string->_M_dataplus)._M_p != '(');
    removeOuterParenthesis(unit_string);
    bVar31 = 1;
    uVar38 = unit_string->_M_string_length;
joined_r0x003e2506:
  } while (uVar38 != 0);
LAB_003e2638:
  sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         unit_string,")]}",0,3);
  sVar19 = unit_string->_M_string_length;
  if (sVar11 < local_598 && sVar11 < sVar19 - 1) {
    do {
      sVar18 = sVar11 + 1;
      pcVar41 = (unit_string->_M_dataplus)._M_p;
      bVar35 = pcVar41[sVar11 + 1];
      uVar8 = (uint)bVar35;
      uVar38 = sVar18;
      if (bVar35 < 0x6f) {
        if ((0x35 < uVar8 - 0x29) ||
           ((0x30000000200043U >> ((ulong)(uVar8 - 0x29) & 0x3f) & 1) == 0)) goto LAB_003e2734;
      }
      else if (bVar35 != 0x7d) {
        if (uVar8 == 0x7b) {
          if (pcVar41[sVar11] == '}') goto LAB_003e2734;
        }
        else if (uVar8 == 0x6f) {
          uVar38 = sVar11 + 3;
          if (((sVar19 <= uVar38) || (pcVar41[sVar11 + 2] != 'f')) ||
             ((cVar6 = pcVar41[uVar38], cVar6 == ')' || ((cVar6 == '}' || (cVar6 == ']')))))) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   sVar18,1,'*');
          }
        }
        else {
LAB_003e2734:
          if (pcVar41[sVar11 - 1] != '\\') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   sVar18,1,'*');
            uVar38 = sVar11 + 2;
          }
        }
      }
      sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_string,")]}",uVar38,3);
      sVar19 = unit_string->_M_string_length;
    } while ((sVar11 < local_598) && (sVar11 < sVar19 - 1));
  }
  if (sVar19 != 0) {
    pcVar41 = (unit_string->_M_dataplus)._M_p;
    pvVar16 = memchr(pcVar41,0x5e,sVar19);
    uVar39 = (long)pvVar16 - (long)pcVar41;
    uVar33 = -(ulong)(pvVar16 == (void *)0x0) | uVar39;
    uVar38 = sVar19 - 3;
    if (uVar33 < local_598 && uVar33 < uVar38) {
      do {
        pcVar41 = (unit_string->_M_dataplus)._M_p;
        uVar33 = uVar39 + 1;
        if (pcVar41[uVar39 + 1] != '-') {
          uVar33 = uVar39;
        }
        if (uVar33 < uVar38) {
          uVar38 = sVar19 - 1;
          if ((byte)(pcVar41[uVar33 + 1] - 0x30U) < 10) {
            lVar32 = 0;
            do {
              if (uVar38 < uVar33 + 1 + lVar32) break;
              lVar26 = lVar32 + uVar33 + 2;
              lVar32 = lVar32 + 1;
            } while ((byte)(pcVar41[lVar26] - 0x30U) < 10);
            sVar11 = lVar32 + 1U + uVar33;
            if (uVar38 < sVar11) break;
            if (1 < lVar32 + 1U) {
              uVar8 = (byte)pcVar41[sVar11] - 0x2a;
              if (((0x3b < uVar8) || ((0x810000008000021U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) &&
                 (pcVar41[sVar11] != 0)) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         unit_string,sVar11,1,'*');
                sVar19 = unit_string->_M_string_length;
              }
            }
          }
          else if (uVar38 <= uVar33) break;
        }
        uVar33 = uVar33 + 2;
        if (sVar19 < uVar33 || sVar19 - uVar33 == 0) {
          if (sVar19 == 0) goto LAB_003e29e0;
          break;
        }
        pcVar41 = (unit_string->_M_dataplus)._M_p;
        pvVar16 = memchr(pcVar41 + uVar33,0x5e,sVar19 - uVar33);
        uVar39 = (long)pvVar16 - (long)pcVar41;
        uVar33 = -(ulong)(pvVar16 == (void *)0x0) | uVar39;
        if ((local_598 <= uVar33) || (uVar38 = sVar19 - 3, uVar38 <= uVar33)) break;
      } while( true );
    }
    if (*(unit_string->_M_dataplus)._M_p == '/') {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unit_string,0,0,1,'1');
      bVar31 = 1;
    }
  }
LAB_003e29e0:
  if (((match_flags >> 0x24 & 1) == 0) && (unit_string->_M_string_length != 0)) {
    pcVar41 = (unit_string->_M_dataplus)._M_p;
    pvVar16 = memchr(pcVar41,0x7b,unit_string->_M_string_length);
    pcVar41 = (pointer)((long)pvVar16 - (long)pcVar41);
    if (pcVar41 != (pointer)0xffffffffffffffff && pvVar16 != (void *)0x0) {
      while( true ) {
        local_570[0].first._M_dataplus._M_p = pcVar41 + 1;
        bVar43 = segmentcheck(unit_string,'}',(size_t *)local_570);
        if (!bVar43) break;
        pcVar4 = (unit_string->_M_dataplus)._M_p;
        if (pcVar41 + (long)(pcVar4 + 1) !=
            local_570[0].first._M_dataplus._M_p + (long)(pcVar4 + -1)) {
          pcVar36 = local_570[0].first._M_dataplus._M_p + -2;
          do {
            iVar9 = tolower((int)pcVar41[(long)(pcVar4 + 1)]);
            pcVar41[(long)(pcVar4 + 1)] = (char)iVar9;
            pcVar41 = pcVar41 + 1;
          } while (pcVar36 != pcVar41);
        }
        sVar13 = (long)unit_string->_M_string_length - (long)local_570[0].first._M_dataplus._M_p;
        if ((pointer)unit_string->_M_string_length < local_570[0].first._M_dataplus._M_p ||
            sVar13 == 0) break;
        pcVar41 = (unit_string->_M_dataplus)._M_p;
        pvVar16 = memchr(local_570[0].first._M_dataplus._M_p + (long)pcVar41,0x7b,sVar13);
        if ((pvVar16 == (void *)0x0) ||
           (pcVar41 = (pointer)((long)pvVar16 - (long)pcVar41),
           pcVar41 == (pointer)0xffffffffffffffff)) break;
      }
    }
  }
  if (bVar31 == 0) {
    return unit_string->_M_string_length != local_578;
  }
  return true;
LAB_003e2cd3:
  if (iVar9 < 2) {
LAB_003e2dc4:
    if ((0 < iVar9) && (2 < uVar38)) {
      pcVar41 = (unit_string->_M_dataplus)._M_p;
      pvVar16 = memchr(pcVar41 + 2,0x2e,uVar38 - 2);
      lVar32 = (long)pvVar16 - (long)pcVar41;
      lVar26 = lVar32;
      if (lVar32 != -1 && pvVar16 != (void *)0x0) {
LAB_003e2e0e:
        do {
          lVar32 = lVar32 + -1;
          if (lVar32 != 0) {
            if ((byte)(pcVar41[lVar32] - 0x30U) < 10) goto LAB_003e2e0e;
            if ((byte)(pcVar41[lVar32] | 0x20U) == 0x65) {
              pcVar41[lVar26] = '*';
              uVar38 = unit_string->_M_string_length;
            }
          }
          uVar39 = lVar26 + 1;
          if (uVar38 < uVar39 || uVar38 - uVar39 == 0) break;
          pcVar41 = (unit_string->_M_dataplus)._M_p;
          pvVar16 = memchr(pcVar41 + uVar39,0x2e,uVar38 - uVar39);
          if ((pvVar16 == (void *)0x0) ||
             (lVar32 = (long)pvVar16 - (long)pcVar41, lVar26 = lVar32, lVar32 == -1)) break;
        } while( true );
      }
    }
  }
  else {
    if (uVar38 == 0) {
      bVar31 = 1;
      goto LAB_003e23bf;
    }
    pcVar41 = (unit_string->_M_dataplus)._M_p;
    pvVar16 = memchr(pcVar41,0x2e,uVar38);
    if ((long)pvVar16 - (long)pcVar41 != 0xffffffffffffffff && pvVar16 != (void *)0x0) {
      iVar9 = 0;
      uVar39 = (long)pvVar16 - (long)pcVar41;
LAB_003e2d1e:
      do {
        uVar33 = uVar39;
        if (pcVar41[uVar33 + 1] == '.') {
          pcVar41[uVar33 + 1] = '*';
          uVar38 = unit_string->_M_string_length;
          if (uVar38 <= uVar33 + 2) break;
          pcVar41 = (unit_string->_M_dataplus)._M_p;
          pvVar16 = memchr(pcVar41 + uVar33 + 2,0x2e,(uVar38 - uVar33) - 2);
          if (pvVar16 == (void *)0x0) break;
          uVar39 = (long)pvVar16 - (long)pcVar41;
        }
        else {
          uVar39 = uVar33 + 1;
          if ((byte)(pcVar41[uVar33 + 1] - 0x30U) < 10) goto LAB_003e2d1e;
          uVar39 = 0xffffffffffffffff;
          if (uVar33 + 2 < uVar38) {
            pvVar16 = memchr(pcVar41 + uVar33 + 2,0x2e,~(uVar33 + 1) + uVar38);
            uVar39 = -(ulong)(pvVar16 == (void *)0x0) | (long)pvVar16 - (long)pcVar41;
          }
          iVar9 = iVar9 + 1;
        }
      } while (uVar39 != 0xffffffffffffffff);
      goto LAB_003e2dc4;
    }
  }
  bVar31 = 1;
  if ((((uint)match_flags >> 10 & 1) != 0) && (uVar38 != 0)) {
    sVar11 = uVar38 + 1;
    do {
      if (sVar11 == 1) goto LAB_003e23bf;
      sVar18 = sVar11 - 1;
      lVar32 = sVar11 - 2;
      sVar11 = sVar18;
    } while ((unit_string->_M_dataplus)._M_p[lVar32] != '/');
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
               sVar18,1,'(');
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,')')
    ;
  }
  goto LAB_003e23bf;
}

Assistant:

static bool cleanUnitString(std::string& unit_string, std::uint64_t match_flags)
{
    auto slen = unit_string.size();
    bool skipcodereplacement = ((match_flags & skip_code_replacements) != 0);
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 4>
        earlyCodeReplacements{{
            ckpair{"degree", "deg"},
            ckpair{"Degree", "deg"},
            ckpair{"degs ", "deg"},
            ckpair{"deg ", "deg"},
        }};

    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 33>
        allCodeReplacements{{
            ckpair{"sq.", "square"},
            ckpair{"cu.", "cubic"},
            ckpair{"U.S.", "US"},
            ckpair{"10^", "1e"},
            ckpair{"10-", "1e-"},
            ckpair{"^+", "^"},
            ckpair{"'s", "s"},
            ckpair{"ampere", "amp"},
            ckpair{"Ampere", "amp"},
            ckpair{"metre", "meter"},
            ckpair{"Metre", "meter"},
            ckpair{"litre", "liter"},
            ckpair{"Litre", "liter"},
            ckpair{"B.Th.U.", "BTU"},
            ckpair{"B.T.U.", "BTU"},
            ckpair{"Britishthermalunits", "BTU"},
            ckpair{"Britishthermalunitat", "BTU"},
            ckpair{"Britishthermalunit", "BTU"},
            ckpair{"BThU", "BTU"},
            ckpair{"-US", "US"},
            ckpair{"--", "*"},
            // -- is either a double negative or a separator, so make it a
            // multiplier so it doesn't get erased and then converted to a
            // power
            ckpair{"\\\\", "\\\\*"},
            // \\ is always considered a segment terminator so it won't be
            // misinterpreted as a known escape sequence
            ckpair{"perunit", "pu"},
            ckpair{"percent", "%"},
            ckpair{"per-unit", "pu"},
            ckpair{"per unit ", "pu"},
            ckpair{"/square*", "/square"},
            ckpair{"/cubic*", "/cubic"},
            ckpair{"Hz^0.5", "rootHertz"},
            ckpair{"Hz^.5", "rootHertz"},
            ckpair{"Hz^(1/2)", "rootHertz"},
            ckpair{"Hz^1/2", "rootHertz"},
            ckpair{u8"\u221AHz", "rootHertz"},
        }};

    static const std::string spchar = std::string(" \t\n\r") + '\0';
    bool changed = false;
    bool skipMultiply = false;
    std::size_t skipMultiplyInsertionAfter{std::string::npos};
    char tail = unit_string.back();
    if (tail == '^' || tail == '*' || tail == '/') {
        unit_string.pop_back();
        changed = true;
    }
    auto c = unit_string.find_first_not_of(spchar);
    if (c == std::string::npos) {
        unit_string.clear();
        return true;
    }
    if (c != 0) {
        unit_string.erase(0, c);
        c = unit_string.find_first_not_of(spchar);
        changed = true;
    }
    if (unit_string[c] == '/') {
        unit_string.insert(c, 1, '1');
        changed = true;
        skipMultiply = true;
    }
    if (!skipcodereplacement) {
        // Check for unicode or extended characters
        if (std::any_of(unit_string.begin(), unit_string.end(), [](char x) {
                return (static_cast<std::uint8_t>(x) & 0x80U) != 0;
            })) {
            if (unicodeReplacement(unit_string)) {
                changed = true;
            }
        }

        // some code replacement that needs to be done before single character
        // and space replacements
        for (const auto& acode : earlyCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }

        if (unit_string.find_first_of(spchar) != std::string::npos) {
            // deal with some particular string with a space in them
            std::size_t reploc{0};
            // clean up some "per" words
            if (unit_string.compare(0, 4, "per ") == 0) {
                reploc = 2;
                unit_string.replace(0, 4, "1/");
                skipMultiply = true;
            }
            if (ReplaceStringInPlace(unit_string, " per ", 5, "/", 1, reploc)) {
                skipMultiply = true;
            }
            if (reploc > 0) {
                auto ploc = unit_string.find_first_of('(', reploc);
                if (ploc != std::string::npos) {
                    auto fdiv = unit_string.find_first_of('/', reploc);
                    std::size_t ndiv{0};
                    do {
                        ndiv = unit_string.find_first_of('/', fdiv + 1);
                        if (ploc < ndiv) {
                            if (ndiv != std::string::npos) {
                                unit_string.insert(ndiv, 1, ')');
                            } else {
                                unit_string.push_back(')');
                            }
                            unit_string.insert(fdiv + 1, 1, '(');
                            fdiv = ndiv + 2;
                        } else {
                            fdiv = ndiv;
                        }
                    } while (ndiv != std::string::npos);
                }
            }
            checkShortUnits(unit_string, match_flags);
            auto fndP = unit_string.find(" of ");
            while (fndP != std::string::npos) {
                auto nchar = unit_string.find_first_not_of(spchar, fndP + 4);
                if (nchar != std::string::npos) {
                    if (unit_string[nchar] == '(' ||
                        unit_string[nchar] == '[') {
                        skipMultiplyInsertionAfter = fndP;
                        break;
                    }
                }
                fndP = unit_string.find(" of ", fndP + 3);
            }
            changed |= cleanSpaces(unit_string, skipMultiply);
            if (unit_string.empty()) {
                // LCOV_EXCL_START
                return true;
                // LCOV_EXCL_STOP
            }
        }

        checkPowerOf10(unit_string);
    } else {
        auto fndP = unit_string.find("of(");
        if (fndP != std::string::npos) {
            skipMultiplyInsertionAfter = fndP;
        }
    }
    if (unit_string.front() == '(') {
        removeOuterParenthesis(unit_string);
        if (unit_string.empty()) {
            return true;
        }
    }

    if (!skipcodereplacement) {
        // ** means power in some environments
        std::size_t loc{0};
        if (ReplaceStringInPlace(unit_string, "**", 2, "^", 1, loc)) {
            changed = true;
        }
    }
    if ((match_flags & case_insensitive) != 0) {
        ciConversion(unit_string);
        changed = true;
    }
    if (!skipcodereplacement) {
        // deal with some html stuff
        auto bloc = unit_string.find_last_of('<');
        if (bloc != std::string::npos) {
            htmlCodeReplacement(unit_string);
        }
        // some abbreviations and other problematic code replacements
        for (const auto& acode : allCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }
    }
    if (unit_string.size() >= 2) {
        auto eit = unit_string.end() - 1;
        if (*(eit) == '2' || *(eit) == '3') {
            if ((*(eit - 1) == '-' || *(eit - 1) == '+') &&
                unit_string.size() >= 3) {
                --eit;
            }
            if (!isDigitCharacter(*(eit - 1))) {
                switch (*(eit - 1)) {
                    case '^':
                    case 'e':
                    case 'E':
                    case '/':
                    case '+':
                    case '-':
                    case '.':
                        break;
                    case '*':
                        *(eit - 1) = '^';
                        break;
                    default:
                        if (eit[0] != '+') {
                            unit_string.insert(eit, '^');
                        } else {
                            *eit = '^';
                        }

                        break;
                }
            }
        }
    }
    if (!skipcodereplacement) {
        // handle dot notation for multiplication
        auto dotloc = unit_string.find_last_of('.');
        if (dotloc < std::string::npos) {
            // strings always have a null pointer at the end
            if (!isDigitCharacter(unit_string[dotloc + 1])) {
                cleanDotNotation(unit_string, match_flags);
                changed = true;
            }
        }

        // clear empty parenthesis
        auto fndP = unit_string.find("()");
        while (fndP != std::string::npos) {
            if (unit_string.size() > fndP + 2) {
                if (unit_string[fndP + 2] == '^') {
                    unit_string.replace(fndP, 2, "*1");
                } else {
                    unit_string.erase(fndP, 2);
                }
            } else {
                unit_string.erase(fndP, 2);
            }
            fndP = unit_string.find("()", fndP);
        }
        // clear empty brackets, this would indicate commodities but if
        // empty there is no commodity
        clearEmptySegments(unit_string);
        cleanUpPowersOfOne(unit_string);
        if (unit_string.empty()) {
            unit_string.push_back('1');
            return true;
        }
    }
    // remove leading *})],  equivalent of 1* but we don't need to process
    // that further
    while (!unit_string.empty() &&
           (unit_string.front() == '*' || unit_string.front() == '}' ||
            unit_string.front() == ')' || unit_string.front() == ']')) {
        unit_string.erase(0, 1);
        changed = true;
        if (unit_string.empty()) {
            return true;
        }
        // check for parenthesis again
        if (unit_string.front() == '(') {
            removeOuterParenthesis(unit_string);
        }
    }
    // inject multiplies after bracket terminators
    auto fnd = unit_string.find_first_of(")]}");
    while (fnd < unit_string.size() - 1 && fnd < skipMultiplyInsertionAfter) {
        switch (unit_string[fnd + 1]) {
            case '^':
            case '*':
            case '/':
            case ')':
            case ']':
            case '}':
            case '>':
                fnd = unit_string.find_first_of(")]}", fnd + 1);
                break;
            case 'o':  // handle special case of commodity modifier using
                       // "of"
                if (unit_string.size() > fnd + 3) {
                    auto tc2 = unit_string[fnd + 3];
                    if (unit_string[fnd + 2] == 'f' && tc2 != ')' &&
                        tc2 != ']' && tc2 != '}') {
                        fnd = unit_string.find_first_of(")]}", fnd + 3);
                        break;
                    }
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 3);
                break;
            case '{':
                if (unit_string[fnd] != '}') {
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                /* FALLTHRU */
            default:
                if (unit_string[fnd - 1] == '\\') {  // ignore escape sequences
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 2);
                break;
        }
    }
    // insert multiplies after ^#
    fnd = unit_string.find_first_of('^');
    while (fnd < unit_string.size() - 3 && fnd < skipMultiplyInsertionAfter) {
        if (unit_string[fnd + 1] == '-') {
            ++fnd;
        }
        if (fnd < unit_string.size() - 3) {
            std::size_t seq = 1;
            auto p = unit_string[fnd + seq];
            while (p >= '0' && p <= '9' &&
                   fnd + seq <= unit_string.size() - 1U) {
                ++seq;
                p = unit_string[fnd + seq];
            }
            if (fnd + seq > unit_string.size() - 1U) {
                break;
            }
            if (seq > 1) {
                auto c2 = unit_string[fnd + seq];
                if (c2 != '\0' && c2 != '*' && c2 != '/' && c2 != '^' &&
                    c2 != 'e' && c2 != 'E') {
                    unit_string.insert(fnd + seq, 1, '*');
                }
            }
        }
        fnd = unit_string.find_first_of('^', fnd + 2);
    }

    // this still might occur from code replacements or other removal
    if (!unit_string.empty() && unit_string.front() == '/') {
        unit_string.insert(unit_string.begin(), '1');
        changed = true;
    }
    if (!skipcodereplacement) {  // make everything inside {} lower case
        auto bloc = unit_string.find_first_of('{');
        while (bloc != std::string::npos) {
            auto ind = bloc + 1;
            if (segmentcheck(unit_string, '}', ind)) {
                std::transform(
                    unit_string.begin() + bloc + 1,
                    unit_string.begin() + ind - 1,
                    unit_string.begin() + bloc + 1,
                    ::tolower);
                bloc = unit_string.find_first_of('{', ind);
            } else {
                bloc = std::string::npos;
            }
        }
    }
    return (changed || unit_string.size() != slen);
}